

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TrackDescriptor * __thiscall
perfetto::protos::gen::TrackDescriptor::operator=(TrackDescriptor *this,TrackDescriptor *param_1)

{
  TrackDescriptor *param_1_local;
  TrackDescriptor *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  this->uuid_ = param_1->uuid_;
  this->parent_uuid_ = param_1->parent_uuid_;
  ::std::__cxx11::string::operator=((string *)&this->name_,(string *)&param_1->name_);
  protozero::CopyablePtr<perfetto::protos::gen::ProcessDescriptor>::operator=
            (&this->process_,&param_1->process_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeProcessDescriptor>::operator=
            (&this->chrome_process_,&param_1->chrome_process_);
  protozero::CopyablePtr<perfetto::protos::gen::ThreadDescriptor>::operator=
            (&this->thread_,&param_1->thread_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeThreadDescriptor>::operator=
            (&this->chrome_thread_,&param_1->chrome_thread_);
  protozero::CopyablePtr<perfetto::protos::gen::CounterDescriptor>::operator=
            (&this->counter_,&param_1->counter_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

TrackDescriptor::TrackDescriptor(const TrackDescriptor&) = default;